

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

bool __thiscall libDAI::HAK::initProps(HAK *this)

{
  bool bVar1;
  byte bVar2;
  value vVar3;
  unsigned_long uVar4;
  long in_RDI;
  double dVar5;
  InferenceAlgorithm *in_stack_fffffffffffffcc8;
  InferenceAlgorithm *in_stack_fffffffffffffcd0;
  InferenceAlgorithm *this_00;
  allocator<char> *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_249 [40];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  undefined1 local_1a9 [40];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  value local_e8;
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [47];
  bool local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd10,
             (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  bVar1 = InferenceAlgorithm::HasProperty
                    (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd10,
               (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               in_stack_fffffffffffffd00);
    bVar1 = InferenceAlgorithm::HasProperty
                      (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd10,
                 (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
      bVar1 = InferenceAlgorithm::HasProperty
                        (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd10,
                   (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                   in_stack_fffffffffffffd00);
        bVar1 = InferenceAlgorithm::HasProperty
                          (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator(&local_b9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd10,
                     (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     in_stack_fffffffffffffd00);
          bVar1 = InferenceAlgorithm::HasProperty
                            (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd10,
                       (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                       in_stack_fffffffffffffd00);
            local_e8 = (value)InferenceAlgorithm::FromStringTo<libDAI::HAK::ClustersType>
                                        (in_stack_fffffffffffffcc8,(PropertyKey *)0xb46ccd);
            *(value *)(in_RDI + 0x1e8) = local_e8;
            std::__cxx11::string::~string(local_108);
            std::allocator<char>::~allocator(&local_109);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd10,
                       (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                       in_stack_fffffffffffffd00);
            dVar5 = InferenceAlgorithm::FromStringTo<double>
                              (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
            *(double *)(in_RDI + 0x1f0) = dVar5;
            std::__cxx11::string::~string(local_130);
            std::allocator<char>::~allocator(&local_131);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd10,
                       (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                       in_stack_fffffffffffffd00);
            uVar4 = InferenceAlgorithm::FromStringTo<unsigned_long>
                              (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
            *(unsigned_long *)(in_RDI + 0x1f8) = uVar4;
            std::__cxx11::string::~string(local_158);
            std::allocator<char>::~allocator(&local_159);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd10,
                       (char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                       in_stack_fffffffffffffd00);
            uVar4 = InferenceAlgorithm::FromStringTo<unsigned_long>
                              (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
            *(unsigned_long *)(in_RDI + 0x200) = uVar4;
            std::__cxx11::string::~string(local_180);
            std::allocator<char>::~allocator(&local_181);
            this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a9
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08)
                       ,in_stack_fffffffffffffd00);
            bVar2 = InferenceAlgorithm::HasProperty
                              (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
            std::__cxx11::string::~string((string *)(local_1a9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_1a9);
            if ((bVar2 & 1) == 0) {
              *(undefined8 *)(in_RDI + 0x208) = 0;
            }
            else {
              in_stack_fffffffffffffd00 = &local_1d1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffd08),
                         in_stack_fffffffffffffd00);
              dVar5 = InferenceAlgorithm::FromStringTo<double>
                                (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8)
              ;
              *(double *)(in_RDI + 0x208) = dVar5;
              std::__cxx11::string::~string(local_1d0);
              std::allocator<char>::~allocator(&local_1d1);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffd08),
                       in_stack_fffffffffffffd00);
            bVar1 = InferenceAlgorithm::FromStringTo<bool>
                              (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
            *(bool *)(in_RDI + 0x210) = bVar1;
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator(&local_1f9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffd08),
                       in_stack_fffffffffffffd00);
            bVar1 = InferenceAlgorithm::HasProperty
                              (in_stack_fffffffffffffcd0,(PropertyKey *)in_stack_fffffffffffffcc8);
            std::__cxx11::string::~string(local_220);
            std::allocator<char>::~allocator(&local_221);
            if (bVar1) {
              this_00 = (InferenceAlgorithm *)local_249;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffd08),
                         in_stack_fffffffffffffd00);
              uVar4 = InferenceAlgorithm::FromStringTo<unsigned_long>
                                (this_00,(PropertyKey *)in_stack_fffffffffffffcc8);
              *(unsigned_long *)(in_RDI + 0x218) = uVar4;
              std::__cxx11::string::~string((string *)(local_249 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_249);
            }
            else {
              vVar3 = ClustersType::operator_cast_to_value((ClustersType *)(in_RDI + 0x1e8));
              if (vVar3 == LOOP) {
                return false;
              }
            }
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HAK::initProps() {
        if( !HasProperty("clusters") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        if( !HasProperty("doubleloop") )
            return false;
        
        Props.clusters  = FromStringTo<ClustersType>("clusters");
        Props.tol       = FromStringTo<double>("tol");
        Props.maxiter   = FromStringTo<size_t>("maxiter");
        Props.verbose   = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            Props.damping = FromStringTo<double>("damping");
        else
            Props.damping = 0.0;
        Props.doubleloop = FromStringTo<bool>("doubleloop");

        if( HasProperty("loopdepth") )
            Props.loopdepth = FromStringTo<size_t>("loopdepth");
        else if( Props.clusters == ClustersType::LOOP )
            return false;

        return true;
    }